

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> * __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::parseInto
          (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
           *__return_storage_ptr__,CommandLine<Catch::ConfigData> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,ConfigData *config)

{
  pointer pbVar1;
  pointer pcVar2;
  IArgFunction<Catch::ConfigData> *pIVar3;
  long lVar4;
  undefined1 local_90 [8];
  Parser parser;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> tokens;
  size_type *local_50;
  string processName;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_50 = &processName._M_string_length;
  pcVar2 = (pbVar1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + pbVar1->_M_string_length);
  lVar4 = std::__cxx11::string::find_last_of((char *)&local_50,0x167458,0xffffffffffffffff);
  if (lVar4 != -1) {
    std::__cxx11::string::substr((ulong)&parser.inQuotes,(ulong)&local_50);
    std::__cxx11::string::operator=((string *)&local_50,(string *)&parser.inQuotes);
    if ((pointer *)parser._16_8_ !=
        &tokens.
         super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
      operator_delete((void *)parser._16_8_);
    }
  }
  pIVar3 = (this->m_boundProcessName).functionObj;
  (*pIVar3->_vptr_IArgFunction[2])(pIVar3,config,&local_50);
  parser.inQuotes = false;
  parser._17_7_ = 0;
  tokens.
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tokens.
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90._0_4_ = None;
  parser.mode = None;
  parser._4_4_ = 0;
  parser.from._0_1_ = 0;
  Parser::parseIntoTokens
            ((Parser *)local_90,args,
             (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *)
             &parser.inQuotes);
  populate(__return_storage_ptr__,this,
           (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *)
           &parser.inQuotes,config);
  std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::~vector
            ((vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *)
             &parser.inQuotes);
  if (local_50 != &processName._M_string_length) {
    operator_delete(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Parser::Token> parseInto(std::vector<std::string> const& args, ConfigT& config) const {
			std::string processName = args[0];
			std::size_t lastSlash = processName.find_last_of("/\\");
			if (lastSlash != std::string::npos)
				processName = processName.substr(lastSlash + 1);
			m_boundProcessName.set(config, processName);
			std::vector<Parser::Token> tokens;
			Parser parser;
			parser.parseIntoTokens(args, tokens);
			return populate(tokens, config);
		}